

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_operator_suite.cpp
# Opt level: O0

void addition_suite::add_real_with_integer(void)

{
  undefined8 local_110;
  type_conflict9 local_108;
  undefined1 local_ff;
  undefined1 local_fe [2];
  uint local_fc;
  basic_variable<std::allocator<char>_> local_f8;
  undefined1 local_c8 [8];
  basic_variable<std::allocator<char>_> data_1;
  undefined8 local_90;
  type_conflict9 local_88;
  undefined1 local_7f;
  undefined1 local_7e [18];
  int local_6c;
  basic_variable<std::allocator<char>_> local_68;
  undefined1 local_38 [8];
  basic_variable<std::allocator<char>_> data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_68,3.0);
  local_6c = 2;
  trial::dynamic::operator+((basic_variable<std::allocator<char>_> *)local_38,&local_68,&local_6c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_68);
  local_7e[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<double>
                          ((basic_variable<std::allocator<char>_> *)local_38);
  local_7f = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<double>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x9dc,"void addition_suite::add_real_with_integer()",local_7e,&local_7f);
  local_88 = trial::dynamic::basic_variable<std::allocator<char>_>::value<double>
                       ((basic_variable<std::allocator<char>_> *)local_38);
  local_90 = 0x4014000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("data.value<double>()","5.0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x9dd,"void addition_suite::add_real_with_integer()",&local_88,&local_90);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_f8,3.0);
  local_fc = 2;
  trial::dynamic::operator+((basic_variable<std::allocator<char>_> *)local_c8,&local_f8,&local_fc);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_f8);
  local_fe[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<double>
                          ((basic_variable<std::allocator<char>_> *)local_c8);
  local_ff = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<double>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x9e1,"void addition_suite::add_real_with_integer()",local_fe,&local_ff);
  local_108 = trial::dynamic::basic_variable<std::allocator<char>_>::value<double>
                        ((basic_variable<std::allocator<char>_> *)local_c8);
  local_110 = 0x4014000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("data.value<double>()","5.0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x9e2,"void addition_suite::add_real_with_integer()",&local_108,&local_110);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_c8);
  return;
}

Assistant:

void add_real_with_integer()
{
    {
        auto data = variable(3.0) + 2;
        TRIAL_PROTOCOL_TEST_EQUAL(data.same<double>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<double>(), 5.0);
    }
    {
        auto data = variable(3.0) + 2U;
        TRIAL_PROTOCOL_TEST_EQUAL(data.same<double>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<double>(), 5.0);
    }
}